

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  _7zip *zip_00;
  _7zip_entry *p_Var1;
  int iVar2;
  wchar_t wVar3;
  unsigned_long uVar4;
  archive_string_conv *paVar5;
  _7z_folder *p_Var6;
  int *piVar7;
  char *pcVar8;
  bool bVar9;
  archive_string_conv *utf8_conv;
  int64_t offset;
  size_t size;
  uchar *mem;
  void *buff;
  size_t symsize;
  uchar *symname;
  char *ptr;
  char *fflags_text;
  undefined1 local_70 [4];
  int supported_attrs;
  _7z_header_info header;
  uint64_t fidx;
  _7z_folder *folder;
  int ret;
  int r;
  _7zip_entry *zip_entry;
  _7zip *zip;
  archive_entry *entry_local;
  archive_read *a_local;
  
  zip_00 = (_7zip *)a->format->data;
  folder._0_4_ = 0;
  header.attrBools = (uchar *)0x0;
  if (zip_00->has_encrypted_entries == -1) {
    zip_00->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (zip_00->entries == (_7zip_entry *)0x0) {
    memset(local_70,0,0x28);
    iVar2 = slurp_central_directory(a,zip_00,(_7z_header_info *)local_70);
    free_Header((_7z_header_info *)local_70);
    if (iVar2 != 0) {
      return iVar2;
    }
    zip_00->entries_remaining = zip_00->numFiles;
    zip_00->entry = zip_00->entries;
  }
  else {
    zip_00->entry = zip_00->entry + 1;
  }
  p_Var1 = zip_00->entry;
  if ((zip_00->entries_remaining == 0) || (p_Var1 == (_7zip_entry *)0x0)) {
    a_local._4_4_ = 1;
  }
  else {
    zip_00->entries_remaining = zip_00->entries_remaining - 1;
    zip_00->entry_offset = 0;
    zip_00->end_of_entry = '\0';
    uVar4 = crc32(0,0,0);
    zip_00->entry_crc32 = uVar4;
    if (zip_00->sconv == (archive_string_conv *)0x0) {
      paVar5 = archive_string_conversion_from_charset((archive_conflict *)a,"UTF-16LE",L'\x01');
      zip_00->sconv = paVar5;
      if (zip_00->sconv == (archive_string_conv *)0x0) {
        return -0x1e;
      }
    }
    if ((p_Var1 != (_7zip_entry *)0x0) && ((ulong)p_Var1->folderIndex < (zip_00->si).ci.numFolders))
    {
      p_Var6 = (zip_00->si).ci.folders + p_Var1->folderIndex;
      header.attrBools = (uchar *)0x0;
      while( true ) {
        bVar9 = false;
        if (p_Var6 != (_7z_folder *)0x0) {
          bVar9 = header.attrBools < (uchar *)p_Var6->numCoders;
        }
        if (!bVar9) break;
        uVar4 = p_Var6->coders[(long)header.attrBools].codec;
        if (((uVar4 == 0x6f10101) || (uVar4 == 0x6f10303)) || (uVar4 == 0x6f10701)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          zip_00->has_encrypted_entries = 1;
        }
        header.attrBools = header.attrBools + 1;
      }
    }
    if (zip_00->has_encrypted_entries == -1) {
      zip_00->has_encrypted_entries = 0;
    }
    wVar3 = _archive_entry_copy_pathname_l
                      (entry,(char *)p_Var1->utf16name,p_Var1->name_len,zip_00->sconv);
    if (wVar3 != L'\0') {
      piVar7 = __errno_location();
      if (*piVar7 == 0xc) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
        return -0x1e;
      }
      pcVar8 = archive_string_conversion_charset_name(zip_00->sconv);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar8);
      folder._0_4_ = -0x14;
    }
    archive_entry_set_mode(entry,p_Var1->mode);
    if ((p_Var1->flg & 1) != 0) {
      archive_entry_set_mtime(entry,p_Var1->mtime,(ulong)p_Var1->mtime_ns);
    }
    if ((p_Var1->flg & 4) != 0) {
      archive_entry_set_ctime(entry,p_Var1->ctime,(ulong)p_Var1->ctime_ns);
    }
    if ((p_Var1->flg & 2) != 0) {
      archive_entry_set_atime(entry,p_Var1->atime,(ulong)p_Var1->atime_ns);
    }
    if (p_Var1->ssIndex == 0xffffffff) {
      zip_00->entry_bytes_remaining = 0;
      archive_entry_set_size(entry,0);
    }
    else {
      zip_00->entry_bytes_remaining = (zip_00->si).ss.unpackSizes[p_Var1->ssIndex];
      archive_entry_set_size(entry,zip_00->entry_bytes_remaining);
    }
    fflags_text._4_4_ = 7;
    if (((p_Var1->attr & 7) != 0) && (ptr = (char *)malloc(0x16), (uchar *)ptr != (uchar *)0x0)) {
      symname = (uchar *)ptr;
      if ((p_Var1->attr & 1) != 0) {
        strcpy(ptr,",rdonly");
        symname = symname + 7;
      }
      if ((p_Var1->attr & 2) != 0) {
        strcpy((char *)symname,",hidden");
        symname = symname + 7;
      }
      if ((p_Var1->attr & 4) != 0) {
        strcpy((char *)symname,",system");
        symname = symname + 7;
      }
      if (ptr < symname) {
        archive_entry_copy_fflags_text(entry,ptr + 1);
      }
      free(ptr);
    }
    if (zip_00->entry_bytes_remaining == 0) {
      zip_00->end_of_entry = '\x01';
    }
    if ((p_Var1->mode & 0xf000) == 0xa000) {
      symsize = 0;
      buff = (void *)0x0;
      while (zip_00->entry_bytes_remaining != 0) {
        iVar2 = archive_read_format_7zip_read_data(a,&mem,(size_t *)&offset,(int64_t *)&utf8_conv);
        if (iVar2 < -0x14) {
          free((void *)symsize);
          return iVar2;
        }
        size = (size_t)realloc((void *)symsize,(long)buff + offset + 1);
        if ((void *)size == (void *)0x0) {
          free((void *)symsize);
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Symname");
          return -0x1e;
        }
        symsize = size;
        memcpy((void *)(size + (long)buff),mem,offset);
        buff = (void *)(offset + (long)buff);
      }
      if (buff == (void *)0x0) {
        p_Var1->mode = p_Var1->mode & 0xffff0fff;
        p_Var1->mode = p_Var1->mode | 0x8000;
        archive_entry_set_mode(entry,p_Var1->mode);
      }
      else {
        *(undefined1 *)(symsize + (long)buff) = 0;
        paVar5 = archive_string_conversion_from_charset((archive_conflict *)a,"UTF-8",L'\x01');
        if (paVar5 == (archive_string_conv *)0x0) {
          free((void *)symsize);
          return -0x1e;
        }
        _archive_entry_copy_symlink_l(entry,(char *)symsize,(size_t)buff,paVar5);
      }
      free((void *)symsize);
      archive_entry_set_size(entry,0);
    }
    snprintf(zip_00->format_name,0x40,"7-Zip");
    (a->archive).archive_format_name = zip_00->format_name;
    a_local._4_4_ = (int)folder;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0 || zip_entry == NULL)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	// These attributes are supported by the windows implementation of archive_write_disk.
	const int supported_attrs = FILE_ATTRIBUTE_READONLY | FILE_ATTRIBUTE_HIDDEN | FILE_ATTRIBUTE_SYSTEM;

	if (zip_entry->attr & supported_attrs) {
		char *fflags_text, *ptr;
		/* allocate for ",rdonly,hidden,system" */
		fflags_text = malloc(22 * sizeof(*fflags_text));
		if (fflags_text != NULL) {
			ptr = fflags_text;
			if (zip_entry->attr & FILE_ATTRIBUTE_READONLY) {
				strcpy(ptr, ",rdonly");
				ptr = ptr + 7;
			}
			if (zip_entry->attr & FILE_ATTRIBUTE_HIDDEN) {
				strcpy(ptr, ",hidden");
				ptr = ptr + 7;
			}
			if (zip_entry->attr & FILE_ATTRIBUTE_SYSTEM) {
				strcpy(ptr, ",system");
				ptr = ptr + 7;
			}
			if (ptr > fflags_text) {
				archive_entry_copy_fflags_text(entry,
				    fflags_text + 1);
			}
			free(fflags_text);
		}
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no symname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			struct archive_string_conv* utf8_conv;

			symname[symsize] = '\0';

			/* Symbolic links are embedded as UTF-8 strings */
			utf8_conv = archive_string_conversion_from_charset(&a->archive,
			    "UTF-8", 1);
			if (utf8_conv == NULL) {
				free(symname);
				return ARCHIVE_FATAL;
			}

			archive_entry_copy_symlink_l(entry, (const char*)symname, symsize,
			    utf8_conv);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	snprintf(zip->format_name, sizeof(zip->format_name), "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}